

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_data.cpp
# Opt level: O2

void __thiscall duckdb::ErrorData::ErrorData(ErrorData *this,ExceptionType type,string *message)

{
  string sStack_38;
  
  this->initialized = true;
  this->type = type;
  ::std::__cxx11::string::string((string *)&sStack_38,(string *)message);
  SanitizeErrorMessage(&this->raw_message,&sStack_38);
  ::std::__cxx11::string::~string((string *)&sStack_38);
  ConstructFinalMessage_abi_cxx11_(&this->final_message,this);
  (this->extra_info)._M_h._M_buckets = &(this->extra_info)._M_h._M_single_bucket;
  (this->extra_info)._M_h._M_bucket_count = 1;
  (this->extra_info)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->extra_info)._M_h._M_element_count = 0;
  (this->extra_info)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->extra_info)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->extra_info)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

ErrorData::ErrorData(ExceptionType type, const string &message)
    : initialized(true), type(type), raw_message(SanitizeErrorMessage(message)),
      final_message(ConstructFinalMessage()) {
}